

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng::compress(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
                      size_t insize,LodePNGCompressSettings *settings)

{
  uint uVar1;
  uchar *buffer;
  size_t buffersize;
  uchar *local_20;
  size_t local_18;
  
  local_20 = (uchar *)0x0;
  local_18 = 0;
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_zlib_compress(&local_20,&local_18,in,insize,settings);
  }
  else {
    uVar1 = (*settings->custom_zlib)(&local_20,&local_18,in,insize,settings);
  }
  if (local_20 != (uchar *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_20,local_20 + local_18);
    free(local_20);
  }
  return uVar1;
}

Assistant:

unsigned compress(std::vector<unsigned char>& out, const unsigned char* in, size_t insize,
		const LodePNGCompressSettings& settings)
	{
		unsigned char* buffer = 0;
		size_t buffersize = 0;
		unsigned error = zlib_compress(&buffer, &buffersize, in, insize, &settings);
		if (buffer)
		{
			out.insert(out.end(), &buffer[0], &buffer[buffersize]);
			lodepng_free(buffer);
		}
		return error;
	}